

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::Data
          (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *this,
          Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *other)

{
  uchar *puVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Node<unsigned_long_long,_QRenderRule> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  R RVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  if (RVar9.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar3 = other->spans;
      sVar8 = 0;
      do {
        bVar2 = pSVar3->offsets[sVar8 + lVar6];
        if (bVar2 != 0xff) {
          pEVar4 = pSVar3[sVar7].entries;
          pNVar5 = Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::insert
                             (this->spans + sVar7,sVar8);
          puVar1 = (pEVar4->storage).data + (uint)bVar2 * 0x90;
          pNVar5->key = *(unsigned_long_long *)puVar1;
          QRenderRule::QRenderRule(&pNVar5->value,(QRenderRule *)(puVar1 + 8));
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar9.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }